

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void __thiscall
EventDataType::serialize<cereal::PortableBinaryInputArchive>
          (EventDataType *this,PortableBinaryInputArchive *archive)

{
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)archive,&this->name,
             &this->origin);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(name, origin);
    }